

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O1

void __thiscall fizplex::Base::apply_etm(Base *this,ETM *etm,SVector *vec)

{
  double dVar1;
  pointer pNVar2;
  size_t sVar3;
  bool bVar4;
  double *pdVar5;
  Nonzero *v;
  pointer pNVar6;
  SVector *__range1;
  Nonzero *e;
  DVector *pDVar7;
  double local_40;
  
  pNVar6 = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar6 == pNVar2) {
    local_40 = 0.0;
    bVar4 = false;
  }
  else {
    sVar3 = etm->col;
    local_40 = 0.0;
    bVar4 = false;
    do {
      if (pNVar6->index == sVar3) {
        local_40 = pNVar6->value;
        pNVar6->value = 0.0;
        bVar4 = true;
      }
      pNVar6 = pNVar6 + 1;
    } while (pNVar6 != pNVar2);
  }
  if (bVar4) {
    pNVar6 = (etm->eta).values.
             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pNVar6 != (etm->eta).values.
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        dVar1 = pNVar6->value;
        pdVar5 = DVector::operator[](&this->work,pNVar6->index);
        *pdVar5 = dVar1;
        pNVar6 = pNVar6 + 1;
      } while (pNVar6 != (etm->eta).values.
                         super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pNVar6 = (vec->values).
             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = (vec->values).
             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar6 != pNVar2) {
      pDVar7 = &this->work;
      do {
        pdVar5 = DVector::operator[](pDVar7,pNVar6->index);
        if ((0.0 < *pdVar5) ||
           (pdVar5 = DVector::operator[](pDVar7,pNVar6->index), *pdVar5 <= 0.0 && *pdVar5 != 0.0)) {
          pdVar5 = DVector::operator[](pDVar7,pNVar6->index);
          pNVar6->value = *pdVar5 * local_40 + pNVar6->value;
          pdVar5 = DVector::operator[](pDVar7,pNVar6->index);
          *pdVar5 = 0.0;
        }
        pNVar6 = pNVar6 + 1;
      } while (pNVar6 != pNVar2);
    }
    pNVar6 = (etm->eta).values.
             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pNVar6 != (etm->eta).values.
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pDVar7 = &this->work;
      do {
        pdVar5 = DVector::operator[](pDVar7,pNVar6->index);
        if ((0.0 < *pdVar5) ||
           (pdVar5 = DVector::operator[](pDVar7,pNVar6->index), *pdVar5 <= 0.0 && *pdVar5 != 0.0)) {
          sVar3 = pNVar6->index;
          pdVar5 = DVector::operator[](pDVar7,sVar3);
          SVector::add_value(vec,sVar3,*pdVar5 * local_40);
          pdVar5 = DVector::operator[](pDVar7,pNVar6->index);
          *pdVar5 = 0.0;
        }
        pNVar6 = pNVar6 + 1;
      } while (pNVar6 != (etm->eta).values.
                         super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void Base::apply_etm(const ETM &etm, SVector &vec) {
  double mult = 0.0;
  bool found = false;
  // Find nonzero multiplier in vec_i
  for (auto &v : vec) {
    if (v.index == etm.col) {
      found = true;
      mult = v.value;
      v.value =
          0.0; // otherwise v_col = v_col + v_col * mult; should be v_col =
               // v_col * mult
    }
  }
  if (found) {
    for (auto it = etm.eta.cbegin(); it != etm.eta.cend(); ++it)
      work[it->index] = it->value;
    for (auto &e : vec) {
      if (work[e.index] > 0.0 or work[e.index] < 0.0) {
        e.value += work[e.index] * mult;
        work[e.index] = 0.0;
      }
    }
    for (auto it = etm.eta.cbegin(); it != etm.eta.cend(); ++it) {
      if (work[it->index] > 0.0 or work[it->index] < 0.0) {
        vec.add_value(it->index, work[it->index] * mult);
        work[it->index] = 0.0;
      }
    }
  }
}